

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.c
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  sd_lookup_t *psVar2;
  sd_lookup_t *s;
  char *__src;
  option *__filename;
  seqdiff_results_t *results;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  size_t sVar4;
  option *poVar5;
  FILE *pFVar6;
  gzFile pgVar7;
  kseq_t *pkVar8;
  void *pvVar9;
  undefined8 *puVar10;
  void *pvVar11;
  FILE *fp;
  option *unaff_R12;
  sd_lookup_t *psVar12;
  int option_index;
  int local_70;
  int local_6c;
  option *local_68;
  option *local_60;
  undefined4 local_54;
  option *local_50;
  option *local_48;
  option *local_40;
  seqdiff_results_t *local_38;
  
  local_38 = seqdiff_results_init();
  verbose_flag = 0;
  progname = *argv;
  if (1 < argc) {
    local_40 = (option *)0x0;
    local_48 = (option *)0x0;
    local_50 = (option *)0x0;
    local_60 = (option *)0x0;
    local_68 = (option *)0x0;
    local_6c = 0;
    local_70 = 0;
LAB_001018aa:
    local_54 = 0;
    iVar3 = getopt_long(argc,argv,"vVh?sd1:2:a:b:c:",main::long_options,&local_54);
    results = local_38;
    __filename = local_40;
    unaff_R12 = local_48;
    poVar5 = local_50;
    __src = _optarg;
    if (iVar3 < 0x61) {
      if (0x3e < iVar3) {
        if (iVar3 != 0x3f) {
          if (iVar3 != 0x56) goto switchD_001018e5_caseD_65;
          printf("Version is %f\n",0x3fb999999999999a);
        }
        goto LAB_001018aa;
      }
      if (iVar3 == 0x31) {
        sVar4 = strlen(_optarg);
        poVar5 = (option *)malloc(sVar4 + 1);
        local_68 = poVar5;
        goto LAB_00101a07;
      }
      if (iVar3 != 0x32) {
        if (iVar3 == -1) {
          if (verbose_flag != 0) {
            fwrite("verbose flag is set\n",0x14,1,_stderr);
            fprintf(_stderr,"First file is %s\n",local_68);
            fprintf(_stderr,"Second file is %s\n",local_60);
            if (poVar5 == (option *)0x0) {
              main_cold_2();
            }
            else {
              main_cold_1();
            }
            if (local_6c == 0) {
              main_cold_4();
            }
            else {
              main_cold_3();
            }
            if (local_70 != 0) {
              main_cold_5();
            }
          }
          if (local_68 == (option *)0x0) {
            main_cold_11();
          }
          else {
            if (local_60 != (option *)0x0) {
              results->first_file = (char *)local_68;
              results->second_file = (char *)local_60;
              results->use_header = local_6c;
              results->only_summarize = local_70;
              if (((poVar5 == (option *)0x0) || (__filename == (option *)0x0)) ||
                 (unaff_R12 == (option *)0x0)) {
                cmpseq(results);
              }
              else {
                pFVar6 = fopen((char *)poVar5,"w+");
                results->a_output_fp = (FILE *)pFVar6;
                if (pFVar6 == (FILE *)0x0) goto LAB_00101c9a;
                pFVar6 = fopen((char *)__filename,"w+");
                results->b_output_fp = (FILE *)pFVar6;
                if (pFVar6 == (FILE *)0x0) goto LAB_00101ca2;
                pFVar6 = fopen((char *)unaff_R12,"w+");
                results->c_output_fp = (FILE *)pFVar6;
                if (pFVar6 == (FILE *)0x0) goto LAB_00101caa;
                main_cold_6();
              }
              fprintf(_stderr," first_file_total = %d\n",(ulong)(uint)results->first_file_total);
              fprintf(_stderr,"  first_file_uniq = %d\n",(ulong)(uint)results->first_file_uniq);
              fprintf(_stderr,"second_file_total = %d\n",(ulong)(uint)results->second_file_total);
              fprintf(_stderr," second_file_uniq = %d\n",(ulong)(uint)results->second_file_uniq);
              fprintf(_stderr,"           common = %d\n",(ulong)(uint)results->common);
              free(local_68);
              free(local_60);
              if (poVar5 != (option *)0x0) {
                free(poVar5);
              }
              if (__filename != (option *)0x0) {
                free(__filename);
              }
              if (unaff_R12 != (option *)0x0) {
                free(unaff_R12);
              }
              seqdiff_results_destroy(results);
              fclose(_stderr);
              fclose(_stdout);
              fclose(_stdin);
              return 0;
            }
            main_cold_10();
          }
          return 1;
        }
switchD_001018e5_caseD_65:
        abort();
      }
      sVar4 = strlen(_optarg);
      poVar5 = (option *)malloc(sVar4 + 1);
      local_60 = poVar5;
    }
    else {
      unaff_R12 = main::long_options;
      switch(iVar3) {
      case 0x61:
        sVar4 = strlen(_optarg);
        poVar5 = (option *)malloc(sVar4 + 1);
        local_50 = poVar5;
        break;
      case 0x62:
        sVar4 = strlen(_optarg);
        poVar5 = (option *)malloc(sVar4 + 1);
        local_40 = poVar5;
        break;
      case 99:
        sVar4 = strlen(_optarg);
        poVar5 = (option *)malloc(sVar4 + 1);
        local_48 = poVar5;
        break;
      case 100:
        local_6c = 1;
        goto LAB_001018aa;
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_001018e5_caseD_65;
      case 0x68:
        goto switchD_001018e5_caseD_68;
      default:
        if (iVar3 == 0x73) {
          local_70 = 1;
        }
        else {
          if (iVar3 != 0x76) goto switchD_001018e5_caseD_65;
          verbose_flag = 1;
        }
        goto LAB_001018aa;
      }
    }
LAB_00101a07:
    strcpy((char *)poVar5,__src);
    goto LAB_001018aa;
  }
switchD_001018e5_caseD_68:
  show_usage(1);
LAB_00101c9a:
  main_cold_9();
LAB_00101ca2:
  main_cold_8();
LAB_00101caa:
  main_cold_7();
  pgVar7 = (gzFile)gzopen(*(undefined8 *)&unaff_R12->val,"r");
  if (pgVar7 == (gzFile)0x0) {
    unaff_R12 = (option *)&unaff_R12->val;
    cmpseq_cold_2();
  }
  else {
    pkVar8 = kseq_init(pgVar7);
    while (iVar3 = kseq_read(pkVar8), -1 < iVar3) {
      *(int *)&unaff_R12->name = *(int *)&unaff_R12->name + 1;
      sd_add_seq(pkVar8,1,*(int *)&unaff_R12[2].name);
    }
    kseq_destroy(pkVar8);
    gzclose(pgVar7);
    pgVar7 = (gzFile)gzopen(unaff_R12[1].name,"r");
    if (pgVar7 != (gzFile)0x0) {
      pkVar8 = kseq_init(pgVar7);
      while (iVar3 = kseq_read(pkVar8), -1 < iVar3) {
        unaff_R12->has_arg = unaff_R12->has_arg + 1;
        sd_add_seq(pkVar8,2,*(int *)&unaff_R12[2].name);
      }
      kseq_destroy(pkVar8);
      iVar3 = gzclose(pgVar7);
      psVar12 = sd_lookup;
      if (sd_lookup != (sd_lookup_t *)0x0) {
        do {
          psVar2 = (sd_lookup_t *)(psVar12->hh).next;
          iVar3 = psVar12->in_a;
          if (iVar3 == 0) {
            if (psVar12->in_b == 1) {
              *(int *)&unaff_R12->field_0xc = *(int *)&unaff_R12->field_0xc + 1;
              if (*(int *)((long)&unaff_R12[2].name + 4) == 0) {
                iVar3 = fprintf(_stdout,"\t%s\n",psVar12->name);
              }
              fp = (FILE *)unaff_R12[1].flag;
              goto LAB_00101e34;
            }
          }
          else if (iVar3 == 1) {
            iVar3 = psVar12->in_b;
            if (iVar3 == 1) {
              *(int *)&unaff_R12->flag = *(int *)&unaff_R12->flag + 1;
              if (*(int *)((long)&unaff_R12[2].name + 4) == 0) {
                iVar3 = fprintf(_stdout,"%s\t%s\n",psVar12->name);
              }
              fp = *(FILE **)&unaff_R12[1].val;
            }
            else {
              if (iVar3 != 0) goto LAB_00101e50;
              piVar1 = (int *)((long)&unaff_R12->name + 4);
              *piVar1 = *piVar1 + 1;
              if (*(int *)((long)&unaff_R12[2].name + 4) == 0) {
                iVar3 = fprintf(_stdout,"%s\t\n",psVar12->name);
              }
              fp = *(FILE **)&unaff_R12[1].has_arg;
            }
LAB_00101e34:
            if (fp != (FILE *)0x0) {
              print_fasta(fp,psVar12->name,psVar12->comment,psVar12->seq,0x32);
              iVar3 = extraout_EAX;
            }
          }
LAB_00101e50:
          psVar12 = psVar2;
          s = sd_lookup;
        } while (psVar2 != (sd_lookup_t *)0x0);
        while (s != (sd_lookup_t *)0x0) {
          psVar12 = (sd_lookup_t *)(s->hh).next;
          sd_delete_seq(s);
          iVar3 = extraout_EAX_00;
          s = psVar12;
        }
      }
      return iVar3;
    }
  }
  poVar5 = unaff_R12 + 1;
  cmpseq_cold_1();
  pvVar9 = calloc(1,0x70);
  puVar10 = (undefined8 *)calloc(1,0x20);
  puVar10[3] = poVar5;
  pvVar11 = malloc(0xffff);
  *puVar10 = pvVar11;
  *(undefined8 **)((long)pvVar9 + 0x68) = puVar10;
  return (int)pvVar9;
}

Assistant:

int main(int argc, char *argv[]) {
	int c;                          /* character for getopt processing */
	/* command argument variables */
	char *first_file = NULL;
	char *second_file = NULL;
	char *a_output_file = NULL;
	char *b_output_file = NULL;
	char *c_output_file = NULL;
	FILE *a_output_fp = NULL;
	FILE *b_output_fp = NULL;
	FILE *c_output_fp = NULL;
	int use_header = 0;
	int only_summarize = 0;

	/* internal variables */
	seqdiff_results_t *results;
	results = seqdiff_results_init();

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */
	progname = argv[0]; /* capture the program name */
	if (argc < 2) {
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",    no_argument, 0, 'v'},
			{"version",    no_argument, 0, 'V'},
			{"help",       no_argument, 0, 'h'},
			{"summary",    no_argument, 0, 's'},
			{"headers",    no_argument, 0, 'd'},
			{"first",      required_argument, 0, '1'},
			{"second",     required_argument, 0, '2'},
			{"a_output",   required_argument, 0, 'a'},
			{"b_output",   required_argument, 0, 'b'},
			{"c_output",   required_argument, 0, 'c'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long(argc, argv, "vVh?sd1:2:a:b:c:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'V':
				/* version */
				printf("Version is %f\n",VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			case 's':
				only_summarize = 1;
				break;

			case 'd':
				use_header = 1;
				break;

			case '1':
				first_file = (char*) malloc(strlen(optarg)+1);
				strcpy(first_file,optarg);
				break;

			case '2':
				second_file = (char*) malloc(strlen(optarg)+1);
				strcpy(second_file,optarg);
				break;

			case 'a':
				a_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(a_output_file,optarg);
				break;

			case 'b':
				b_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(b_output_file,optarg);
				break;

			case 'c':
				c_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(c_output_file,optarg);
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"First file is %s\n", first_file);
		fprintf(stderr,"Second file is %s\n", second_file);
		if (a_output_file != NULL && a_output_file != NULL && a_output_file != NULL) {
			fprintf(stderr, "Output will be written to files:\n");
			fprintf(stderr, "  first file uniques: %s\n", a_output_file);
			fprintf(stderr, "  second file uniques: %s\n", b_output_file);
			fprintf(stderr, "  common to both input files: %s\n", c_output_file);
		} else
			fprintf(stderr,"No output files will be generated\n");

		if (use_header)
			fprintf(stderr,"Processing will be done using headers, not sequences\n");
		else
			fprintf(stderr,"Processing will be done using sequences\n");
		if (only_summarize)
			fprintf(stderr,"Only showing summary information\n");
	}

	/* check validity of given argument combination */
	if (! first_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	if (! second_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	results->first_file = first_file;
	results->second_file = second_file;
	results->use_header = use_header;
	results->only_summarize = only_summarize;
	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		results->a_output_fp = fopen(a_output_file,"w+");
		if (!results->a_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,a_output_file);
			exit(EXIT_FAILURE);
		}
		results->b_output_fp = fopen(b_output_file,"w+");
		if (!results->b_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,b_output_file);
			exit(EXIT_FAILURE);
		}
		results->c_output_fp = fopen(c_output_file,"w+");
		if (!results->c_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,c_output_file);
			exit(EXIT_FAILURE);
		}
	}

	/* do the comparison */
	cmpseq(results);

	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		fclose(results->a_output_fp);
		fclose(results->b_output_fp);
		fclose(results->c_output_fp);
	}

	/* report results */
	fprintf(stderr, " first_file_total = %d\n", results->first_file_total);
	fprintf(stderr, "  first_file_uniq = %d\n", results->first_file_uniq);
	fprintf(stderr, "second_file_total = %d\n", results->second_file_total);
	fprintf(stderr, " second_file_uniq = %d\n", results->second_file_uniq);
	fprintf(stderr, "           common = %d\n",           results->common);

	free(first_file);
	free(second_file);
	if (a_output_file != NULL)
		free(a_output_file);
	if (b_output_file != NULL)
		free(b_output_file);
	if (c_output_file != NULL)
		free(c_output_file);

	/* clean up */
	seqdiff_results_destroy(results);
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}